

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_configuration_ptr __thiscall
APhyBullet::BulletEngine::createDefaultCollisionConfiguration(BulletEngine *this)

{
  collision_configuration_ptr prVar1;
  btDefaultCollisionConfiguration *this_00;
  collision_configuration_ptr local_40;
  btDefaultCollisionConstructionInfo local_38;
  
  this_00 = (btDefaultCollisionConfiguration *)::operator_new(0xb8);
  local_38.m_persistentManifoldPool = (btPoolAllocator *)0x0;
  local_38.m_collisionAlgorithmPool = (btPoolAllocator *)0x0;
  local_38.m_defaultMaxPersistentManifoldPoolSize = 0x1000;
  local_38.m_defaultMaxCollisionAlgorithmPoolSize = 0x1000;
  local_38.m_customCollisionAlgorithmMaxElementSize = 0;
  local_38.m_useEpaPenetrationAlgorithm = 1;
  btDefaultCollisionConfiguration::btDefaultCollisionConfiguration(this_00,&local_38);
  aphy::
  makeObjectWithInterface<aphy::collision_configuration,APhyBullet::BulletCollisionConfiguration,btDefaultCollisionConfiguration*>
            ((aphy *)&local_40,this_00);
  prVar1 = local_40;
  local_40 = (collision_configuration_ptr)0x0;
  aphy::ref<aphy::collision_configuration>::~ref((ref<aphy::collision_configuration> *)&local_40);
  return prVar1;
}

Assistant:

collision_configuration_ptr BulletEngine::createDefaultCollisionConfiguration()
{
    return makeObject<BulletCollisionConfiguration> (new btDefaultCollisionConfiguration ()).disown();
}